

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDHash * __thiscall
ON_SubDimple::SubDHash
          (ON_SubDHash *__return_storage_ptr__,ON_SubDimple *this,ON_SubDHashType hash_type,
          bool bForceUpdate)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ON__UINT64 OVar4;
  undefined3 uVar5;
  ON_SubDLevel *pOVar6;
  ON__UINT64 OVar7;
  long lVar8;
  ON_SubDHash *pOVar9;
  ON_SubDHash *pOVar10;
  ON_SubDHash *pOVar11;
  ON_SubDHash *pOVar12;
  byte bVar13;
  ON_SubDHash local_90;
  
  bVar13 = 0;
  pOVar6 = this->m_active_level;
  if (pOVar6 == (ON_SubDLevel *)0x0) {
    pOVar6 = &ON_SubDLevel::Empty;
  }
  uVar1 = pOVar6->m_vertex_count;
  pOVar12 = __return_storage_ptr__;
  if ((uVar1 == 0) || (2 < (byte)(hash_type - TopologyAndEdgeCreases))) {
    pOVar10 = &ON_SubDHash::Empty;
    lVar8 = 0xc;
    goto LAB_005cd9ad;
  }
  pOVar10 = (ON_SubDHash *)
            ((this->m_subd_toplology_hash).m_vertex_hash.m_digest +
            *(long *)(&DAT_006ce600 + (ulong)(byte)(hash_type - TopologyAndEdgeCreases) * 8) + -0x38
            );
  uVar2 = pOVar6->m_edge_count;
  uVar3 = pOVar6->m_face_count;
  OVar4 = this->RuntimeSerialNumber;
  OVar7 = GeometryContentSerialNumber(this);
  if (bForceUpdate) {
LAB_005cd966:
    ON_SubDHash::Create(&local_90,hash_type,this);
    pOVar9 = &local_90;
    pOVar11 = pOVar10;
    for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar5 = *(undefined3 *)&pOVar9->field_0x1;
      uVar1 = pOVar9->m_vertex_count;
      pOVar11->m_hash_type = pOVar9->m_hash_type;
      *(undefined3 *)&pOVar11->field_0x1 = uVar5;
      pOVar11->m_vertex_count = uVar1;
      pOVar9 = (ON_SubDHash *)((long)pOVar9 + (ulong)bVar13 * -0x10 + 8);
      pOVar11 = (ON_SubDHash *)((long)pOVar11 + (ulong)bVar13 * -0x10 + 8);
    }
    *(undefined4 *)((pOVar10->m_face_hash).m_digest + 0x10) = local_90.m_face_hash.m_digest._16_4_;
  }
  else if (((((pOVar10->m_vertex_count == 0 || pOVar10->m_hash_type == Unset) ||
             (OVar4 == 0 || pOVar10->m_hash_type != hash_type)) || (OVar7 == 0)) ||
           ((OVar4 != pOVar10->m_subd_runtime_serial_number ||
            (OVar7 != pOVar10->m_subd_geometry_content_serial_number)))) ||
          ((uVar1 != pOVar10->m_vertex_count ||
           ((uVar2 != pOVar10->m_edge_count || (uVar3 != pOVar10->m_face_count))))))
  goto LAB_005cd966;
  lVar8 = 0xc;
LAB_005cd9ad:
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar5 = *(undefined3 *)&pOVar10->field_0x1;
    uVar1 = pOVar10->m_vertex_count;
    pOVar12->m_hash_type = pOVar10->m_hash_type;
    *(undefined3 *)&pOVar12->field_0x1 = uVar5;
    pOVar12->m_vertex_count = uVar1;
    pOVar10 = (ON_SubDHash *)((long)pOVar10 + (ulong)bVar13 * -0x10 + 8);
    pOVar12 = (ON_SubDHash *)((long)pOVar12 + (ulong)bVar13 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDHash ON_SubDimple::SubDHash(
  ON_SubDHashType hash_type,
  bool bForceUpdate
) const
{
  const unsigned vertex_count = this->ActiveLevel().m_vertex_count;
  if (0 == vertex_count)
    return ON_SubDHash::Empty;

  // m_subd_topologyX_hash, m_subd_topology_and_edge_crease_hash, and m_subd_geometry_hash
  // are mutable and use lazy evaluation to stay updated.
  // subd.GeometryContentSerialNumber() is used to detect stale values.
  ON_SubDHash* h;
  switch (hash_type)
  {
  case ON_SubDHashType::Topology:
    h = &this->m_subd_toplology_hash;
    break;
  case ON_SubDHashType::TopologyAndEdgeCreases:
    h = &this->m_subd_toplology_and_edge_creases_hash;
    break;
  case ON_SubDHashType::Geometry:
    h = &this->m_subd_geometry_hash;
    break;
  default:
    h = nullptr;
    break;
  }
  if ( nullptr == h)
    return ON_SubDHash::Empty;


  const unsigned edge_count = this->ActiveLevel().m_edge_count;
  const unsigned face_count = this->ActiveLevel().m_face_count;
  const ON__UINT64 rsn = this->RuntimeSerialNumber;
  const ON__UINT64 gsn = this->GeometryContentSerialNumber();
  if (
    false == bForceUpdate
    && h->IsNotEmpty()
    && hash_type == h->HashType()
    && rsn > 0 && rsn == h->SubDRuntimeSerialNumber()
    && gsn > 0 && gsn == h->SubDGeometryContentSerialNumber()
    && vertex_count == h->VertexCount()
    && edge_count == h->EdgeCount()
    && face_count == h->FaceCount()
    )
  {
    // The cache hash values are up to date (or should be).
    // If h is out of date, something somewhere modified the SubD components and 
    // failed to change the GeometryContentSerialNumber(). 
    // All C++ SDK opennurbs code changes gsn after modifying SubD geometry (or it's a bug that should be fixed).
    // The unwashed masses can do just about anything and that's why the bForceUpdate parameter is supplied.
    return *h;
  }

  // update cached value
  *h = ON_SubDHash::Create(hash_type,this);

  // return updated value
  return *h;
}